

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPSession::Create
          (RTPSession *this,RTPSessionParams *sessparams,RTPTransmissionParams *transparams,
          TransmissionProtocol protocol)

{
  RTPTransmitter *pRVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  RTPUDPv4Transmitter *this_00;
  RTPUDPv6Transmitter *this_01;
  RTPExternalTransmitter *this_02;
  undefined4 extraout_var;
  RTPTCPTransmitter *this_03;
  RTPMemoryManager *pRVar5;
  int status;
  TransmissionProtocol protocol_local;
  RTPTransmissionParams *transparams_local;
  RTPSessionParams *sessparams_local;
  RTPSession *this_local;
  
  if ((this->created & 1U) == 0) {
    bVar2 = RTPSessionParams::IsUsingPollThread(sessparams);
    this->usingpollthread = bVar2;
    bVar2 = RTPSessionParams::NeedThreadSafety(sessparams);
    this->needthreadsafety = bVar2;
    if (((this->usingpollthread & 1U) == 0) || ((this->needthreadsafety & 1U) != 0)) {
      bVar2 = RTPSessionParams::GetSenderReportForBYE(sessparams);
      this->useSR_BYEifpossible = bVar2;
      this->sentpackets = false;
      sVar4 = RTPSessionParams::GetMaximumPacketSize(sessparams);
      this->maxpacksize = sVar4;
      if (sVar4 < 600) {
        this_local._4_4_ = -0x3d;
      }
      else {
        this->rtptrans = (RTPTransmitter *)0x0;
        switch(protocol) {
        case IPv4UDPProto:
          pRVar5 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
          this_00 = (RTPUDPv4Transmitter *)operator_new(0x30ce0,pRVar5,0x1d);
          pRVar5 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
          RTPUDPv4Transmitter::RTPUDPv4Transmitter(this_00,pRVar5);
          this->rtptrans = (RTPTransmitter *)this_00;
          break;
        case IPv6UDPProto:
          pRVar5 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
          this_01 = (RTPUDPv6Transmitter *)operator_new(0x30ce8,pRVar5,0x1d);
          pRVar5 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
          RTPUDPv6Transmitter::RTPUDPv6Transmitter(this_01,pRVar5);
          this->rtptrans = (RTPTransmitter *)this_01;
          break;
        case TCPProto:
          pRVar5 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
          this_03 = (RTPTCPTransmitter *)operator_new(200,pRVar5,0x1d);
          pRVar5 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
          RTPTCPTransmitter::RTPTCPTransmitter(this_03,pRVar5);
          this->rtptrans = (RTPTransmitter *)this_03;
          break;
        case ExternalProto:
          pRVar5 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
          this_02 = (RTPExternalTransmitter *)operator_new(0x68,pRVar5,0x1d);
          pRVar5 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
          RTPExternalTransmitter::RTPExternalTransmitter(this_02,pRVar5);
          this->rtptrans = (RTPTransmitter *)this_02;
          break;
        case UserDefinedProto:
          iVar3 = (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[2])();
          this->rtptrans = (RTPTransmitter *)CONCAT44(extraout_var,iVar3);
          if (this->rtptrans == (RTPTransmitter *)0x0) {
            return -0x77;
          }
          break;
        default:
          return -0x3f;
        }
        if (this->rtptrans == (RTPTransmitter *)0x0) {
          this_local._4_4_ = -1;
        }
        else {
          this_local._4_4_ =
               (*(this->rtptrans->super_RTPMemoryObject)._vptr_RTPMemoryObject[2])
                         (this->rtptrans,(ulong)this->needthreadsafety & 1);
          if (this_local._4_4_ < 0) {
            pRVar1 = this->rtptrans;
            pRVar5 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
            RTPDelete<jrtplib::RTPTransmitter>(pRVar1,pRVar5);
          }
          else {
            this_local._4_4_ =
                 (*(this->rtptrans->super_RTPMemoryObject)._vptr_RTPMemoryObject[3])
                           (this->rtptrans,this->maxpacksize,transparams);
            if (this_local._4_4_ < 0) {
              pRVar1 = this->rtptrans;
              pRVar5 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
              RTPDelete<jrtplib::RTPTransmitter>(pRVar1,pRVar5);
            }
            else {
              this->deletetransmitter = true;
              this_local._4_4_ = InternalCreate(this,sessparams);
            }
          }
        }
      }
    }
    else {
      this_local._4_4_ = -0xb1;
    }
  }
  else {
    this_local._4_4_ = -0x3a;
  }
  return this_local._4_4_;
}

Assistant:

int RTPSession::Create(const RTPSessionParams &sessparams,const RTPTransmissionParams *transparams /* = 0 */,
		       RTPTransmitter::TransmissionProtocol protocol)
{
	int status;
	
	if (created)
		return ERR_RTP_SESSION_ALREADYCREATED;

	usingpollthread = sessparams.IsUsingPollThread();
	needthreadsafety = sessparams.NeedThreadSafety();
	if (usingpollthread && !needthreadsafety)
		return ERR_RTP_SESSION_THREADSAFETYCONFLICT;

	useSR_BYEifpossible = sessparams.GetSenderReportForBYE();
	sentpackets = false;
	
	// Check max packet size
	
	if ((maxpacksize = sessparams.GetMaximumPacketSize()) < RTP_MINPACKETSIZE)
		return ERR_RTP_SESSION_MAXPACKETSIZETOOSMALL;
		
	// Initialize the transmission component
	
	rtptrans = 0;
	switch(protocol)
	{
	case RTPTransmitter::IPv4UDPProto:
		rtptrans = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPTRANSMITTER) RTPUDPv4Transmitter(GetMemoryManager());
		break;
#ifdef RTP_SUPPORT_IPV6
	case RTPTransmitter::IPv6UDPProto:
		rtptrans = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPTRANSMITTER) RTPUDPv6Transmitter(GetMemoryManager());
		break;
#endif // RTP_SUPPORT_IPV6
	case RTPTransmitter::ExternalProto:
		rtptrans = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPTRANSMITTER) RTPExternalTransmitter(GetMemoryManager());
		break;
	case RTPTransmitter::UserDefinedProto:
		rtptrans = NewUserDefinedTransmitter();
		if (rtptrans == 0)
			return ERR_RTP_SESSION_USERDEFINEDTRANSMITTERNULL;
		break;
	case RTPTransmitter::TCPProto:
		rtptrans = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPTRANSMITTER) RTPTCPTransmitter(GetMemoryManager());
		break;
	default:
		return ERR_RTP_SESSION_UNSUPPORTEDTRANSMISSIONPROTOCOL;
	}
	
	if (rtptrans == 0)
		return ERR_RTP_OUTOFMEM;
	if ((status = rtptrans->Init(needthreadsafety)) < 0)
	{
		RTPDelete(rtptrans,GetMemoryManager());
		return status;
	}
	if ((status = rtptrans->Create(maxpacksize,transparams)) < 0)
	{
		RTPDelete(rtptrans,GetMemoryManager());
		return status;
	}

	deletetransmitter = true;
	return InternalCreate(sessparams);
}